

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsOptions.cpp
# Opt level: O3

OptionStatus
getLocalOptionValues
          (HighsLogOptions *report_log_options,string *option,
          vector<OptionRecord_*,_std::allocator<OptionRecord_*>_> *option_records,
          bool *current_value,bool *default_value)

{
  OptionRecord *pOVar1;
  pointer pcVar2;
  OptionStatus OVar3;
  OptionStatus OVar4;
  HighsInt index;
  int local_4c;
  string local_48;
  
  OVar3 = getOptionIndex(report_log_options,option,option_records,&local_4c);
  OVar4 = kUnknownOption;
  if (OVar3 == kOk) {
    pOVar1 = (option_records->super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>).
             _M_impl.super__Vector_impl_data._M_start[local_4c];
    if (pOVar1->type == kBool) {
      if (current_value != (bool *)0x0) {
        *current_value = *(bool *)pOVar1[1]._vptr_OptionRecord;
      }
      OVar4 = kOk;
      if (default_value != (bool *)0x0) {
        *default_value = SUB41(pOVar1[1].type,0);
        OVar4 = kOk;
      }
    }
    else {
      pcVar2 = (option->_M_dataplus)._M_p;
      optionEntryTypeToString_abi_cxx11_(&local_48,pOVar1->type);
      highsLogUser(report_log_options,kError,
                   "getLocalOptionValue: Option \"%s\" requires value of type %s, not bool\n",pcVar2
                   ,local_48._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p);
      }
      OVar4 = kIllegalValue;
    }
  }
  return OVar4;
}

Assistant:

OptionStatus getLocalOptionValues(
    const HighsLogOptions& report_log_options, const std::string& option,
    const std::vector<OptionRecord*>& option_records, bool* current_value,
    bool* default_value) {
  HighsInt index;
  OptionStatus status =
      getOptionIndex(report_log_options, option, option_records, index);
  if (status != OptionStatus::kOk) return status;
  HighsOptionType type = option_records[index]->type;
  if (type != HighsOptionType::kBool) {
    highsLogUser(report_log_options, HighsLogType::kError,
                 "getLocalOptionValue: Option \"%s\" requires value of type "
                 "%s, not bool\n",
                 option.c_str(), optionEntryTypeToString(type).c_str());
    return OptionStatus::kIllegalValue;
  }
  OptionRecordBool& option_record =
      ((OptionRecordBool*)option_records[index])[0];
  if (current_value) *current_value = *(option_record.value);
  if (default_value) *default_value = option_record.default_value;
  return OptionStatus::kOk;
}